

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_csharp.cpp
# Opt level: O0

string * __thiscall
flatbuffers::csharp::CSharpGenerator::GenTypeName_ObjectAPI
          (string *__return_storage_ptr__,CSharpGenerator *this,string *name,IDLOptions *opts)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  IDLOptions *local_28;
  IDLOptions *opts_local;
  string *name_local;
  CSharpGenerator *this_local;
  
  local_28 = opts;
  opts_local = (IDLOptions *)name;
  name_local = (string *)this;
  this_local = (CSharpGenerator *)__return_storage_ptr__;
  std::operator+(&local_48,&opts->object_prefix,name);
  std::operator+(__return_storage_ptr__,&local_48,&local_28->object_suffix);
  std::__cxx11::string::~string((string *)&local_48);
  return __return_storage_ptr__;
}

Assistant:

std::string GenTypeName_ObjectAPI(const std::string &name,
                                    const IDLOptions &opts) const {
    return opts.object_prefix + name + opts.object_suffix;
  }